

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O0

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Parser,false>
          (NumberParser *this,Parser *stream)

{
  Token base;
  Token size;
  Token baseToken_00;
  Token sizeToken_00;
  Token first_00;
  Token token_00;
  Token sizeToken_01;
  Token baseToken_01;
  Token baseToken_02;
  Token token_01;
  Token firstToken;
  int iVar1;
  SourceLocation offset;
  ParserBase *in_RDX;
  long in_RSI;
  ParserBase *in_RDI;
  bool bVar2;
  Token TVar3;
  int index;
  Token next;
  int count;
  Token first;
  anon_class_16_2_f88ffae6 createSimple;
  Token token;
  Token baseToken;
  Token sizeToken;
  bool isNegated;
  ParserBase *in_stack_fffffffffffffe18;
  Token *in_stack_fffffffffffffe20;
  TokenKind in_stack_fffffffffffffe2e;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  bool bVar4;
  ParserBase *this_00;
  anon_class_16_2_f88ffae6 *in_stack_fffffffffffffe50;
  Info *local_158;
  NumberParser *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  Info *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined2 in_stack_fffffffffffffef0;
  TokenKind kind;
  undefined6 in_stack_fffffffffffffef2;
  undefined6 uVar5;
  Info *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int iVar6;
  NumberParser *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  Info *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Info *in_stack_ffffffffffffff30;
  TokenKind local_c8;
  NumberParser *in_stack_ffffffffffffff48;
  Info *in_stack_ffffffffffffff50;
  NumberParser *in_stack_ffffffffffffff58;
  NumberParser *local_98;
  Info *local_90;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  NumberParser *in_stack_ffffffffffffff90;
  NumberParser *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  NumberParser *local_58;
  Info *local_50;
  NumberParser *local_48;
  Info *local_40;
  NumberParser *local_38;
  Info *local_30;
  
  this_00 = in_RDI;
  ParserBase::getLastConsumed(in_RDX);
  Token::Token(in_stack_fffffffffffffe20);
  Token::Token(in_stack_fffffffffffffe20);
  TVar3 = ParserBase::consume(this_00);
  local_58._0_2_ = TVar3.kind;
  bVar2 = (TokenKind)local_58 == IntegerBase;
  local_58 = TVar3._0_8_;
  local_50 = TVar3.info;
  if (bVar2) {
    local_48 = local_58;
    local_40 = local_50;
    Token::Token(in_stack_fffffffffffffe20);
    baseToken_01.info = in_stack_ffffffffffffff30;
    baseToken_01.kind = (short)in_stack_ffffffffffffff28;
    baseToken_01._2_1_ = (char)((ulong)in_stack_ffffffffffffff28 >> 0x10);
    baseToken_01.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff28 >> 0x18);
    baseToken_01.rawLen = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    sizeToken_01.info = in_stack_ffffffffffffff20;
    sizeToken_01.kind = (short)in_stack_ffffffffffffff18;
    sizeToken_01._2_1_ = (char)((ulong)in_stack_ffffffffffffff18 >> 0x10);
    sizeToken_01.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff18 >> 0x18);
    sizeToken_01.rawLen = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    startVector(in_stack_ffffffffffffff10,baseToken_01,sizeToken_01);
  }
  else {
    bVar2 = ParserBase::peek((ParserBase *)
                             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                             in_stack_fffffffffffffe2e);
    if (!bVar2) {
      parseInteger<slang::parsing::Parser,_false>::anon_class_16_2_f88ffae6::operator()
                (in_stack_fffffffffffffe50);
      return (IntResult *)this_00;
    }
    local_38 = local_58;
    local_30 = local_50;
    TVar3 = ParserBase::consume(this_00);
    local_98 = TVar3._0_8_;
    local_48 = local_98;
    local_90 = TVar3.info;
    local_40 = local_90;
    baseToken_02.info = in_stack_ffffffffffffff30;
    baseToken_02.kind = (short)in_stack_ffffffffffffff28;
    baseToken_02._2_1_ = (char)((ulong)in_stack_ffffffffffffff28 >> 0x10);
    baseToken_02.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff28 >> 0x18);
    baseToken_02.rawLen = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    TVar3.info = in_stack_ffffffffffffff20;
    TVar3.kind = (short)in_stack_ffffffffffffff18;
    TVar3._2_1_ = (char)((ulong)in_stack_ffffffffffffff18 >> 0x10);
    TVar3.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff18 >> 0x18);
    TVar3.rawLen = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    startVector(in_stack_ffffffffffffff10,baseToken_02,TVar3);
    in_stack_ffffffffffffff48 = local_58;
    in_stack_ffffffffffffff50 = local_50;
    in_stack_ffffffffffffff58 = local_98;
    local_58 = in_stack_ffffffffffffff98;
    local_50 = in_stack_ffffffffffffffa0;
  }
  _local_c8 = ParserBase::peek(in_stack_fffffffffffffe18);
  bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_c8);
  if (bVar2) {
    iVar6 = 0;
    kind = local_c8;
    uVar5 = local_c8._2_6_;
    local_158 = local_c8._8_8_;
    offset = Token::location((Token *)&local_c8);
    *(SourceLocation *)(in_RSI + 0x10) = offset;
    do {
      iVar6 = iVar6 + 1;
      token_01.info = (Info *)in_stack_ffffffffffffff58;
      token_01._0_8_ = in_stack_ffffffffffffff50;
      iVar1 = append(in_stack_ffffffffffffff48,token_01,local_c8._15_1_);
      ParserBase::consume(this_00);
      if (-1 < iVar1) {
        token_00.info._0_4_ = in_stack_ffffffffffffff00;
        token_00._0_8_ = local_158;
        token_00.info._4_4_ = iVar6;
        Parser::handleExponentSplit((Parser *)CONCAT62(uVar5,kind),token_00,(size_t)offset);
        break;
      }
      TVar3 = ParserBase::peek(in_stack_fffffffffffffe18);
      kind = TVar3.kind;
      uVar5 = TVar3._2_6_;
      local_158 = TVar3.info;
      bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(kind);
      bVar4 = false;
      if (bVar2) {
        Token::trivia((Token *)this_00);
        bVar4 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                          ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x6b5e03);
      }
    } while (bVar4 != false);
    firstToken.info = local_50;
    firstToken._0_8_ = local_58;
    TVar3 = finishValue(in_stack_ffffffffffffff90,firstToken,(bool)in_stack_ffffffffffffff8f,
                        (bool)in_stack_ffffffffffffff8e);
    size.info = local_30;
    size._0_8_ = local_38;
    base.info = local_40;
    base._0_8_ = local_48;
    IntResult::vector((IntResult *)in_RDI,size,base,TVar3);
  }
  else {
    sizeToken_00.info._0_4_ = in_stack_fffffffffffffee0;
    sizeToken_00.kind = (short)in_stack_fffffffffffffed8;
    sizeToken_00._2_1_ = (char)((ulong)in_stack_fffffffffffffed8 >> 0x10);
    sizeToken_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffed8 >> 0x18);
    sizeToken_00.rawLen = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    sizeToken_00.info._4_4_ = in_stack_fffffffffffffee4;
    baseToken_00.info = in_stack_fffffffffffffed0;
    baseToken_00.kind = (short)in_stack_fffffffffffffec8;
    baseToken_00._2_1_ = (char)((ulong)in_stack_fffffffffffffec8 >> 0x10);
    baseToken_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffec8 >> 0x18);
    baseToken_00.rawLen = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    first_00._2_6_ = in_stack_fffffffffffffef2;
    first_00.kind = in_stack_fffffffffffffef0;
    first_00.info = in_stack_fffffffffffffef8;
    reportMissingDigits(in_stack_fffffffffffffec0,sizeToken_00,baseToken_00,first_00);
  }
  return (IntResult *)this_00;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }